

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O2

string * __thiscall
spirv_cross::CompilerGLSL::to_dereferenced_expression_abi_cxx11_
          (string *__return_storage_ptr__,CompilerGLSL *this,uint32_t id,
          bool register_expression_read)

{
  bool bVar1;
  SPIRType *expr_type;
  string sStack_48;
  
  expr_type = Compiler::expression_type(&this->super_Compiler,id);
  if ((expr_type->pointer == true) && (bVar1 = should_dereference(this,id), bVar1)) {
    to_enclosed_expression_abi_cxx11_(&sStack_48,this,id,register_expression_read);
    dereference_expression(__return_storage_ptr__,this,expr_type,&sStack_48);
    ::std::__cxx11::string::~string((string *)&sStack_48);
    return __return_storage_ptr__;
  }
  to_expression_abi_cxx11_(__return_storage_ptr__,this,id,register_expression_read);
  return __return_storage_ptr__;
}

Assistant:

string CompilerGLSL::to_dereferenced_expression(uint32_t id, bool register_expression_read)
{
	auto &type = expression_type(id);
	if (type.pointer && should_dereference(id))
		return dereference_expression(type, to_enclosed_expression(id, register_expression_read));
	else
		return to_expression(id, register_expression_read);
}